

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O0

void __thiscall glTF2::Object::~Object(Object *this)

{
  Object *this_local;
  
  ~Object(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~Object() {}